

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.hpp
# Opt level: O2

ws_header_status __thiscall
cinatra::websocket::parse_header(websocket *this,char *buf,size_t size,bool is_server)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  long lStack_8;
  
  this->msg_opcode_ = *buf & 0xf;
  this->msg_fin_ = (byte)*buf >> 7;
  bVar1 = buf[1];
  uVar5 = bVar1 & 0x7f;
  this->left_header_len_ = 0;
  bVar4 = (byte)uVar5;
  if (bVar4 < 0x7e) {
    this->len_bytes_ = SHORT_HEADER;
    this->payload_length_ = (ulong)uVar5;
    lStack_8 = 2;
    sVar3 = 0;
  }
  else if (bVar4 == 0x7e) {
    this->len_bytes_ = MEDIUM_HEADER;
    this->payload_length_ = (ulong)(ushort)(*(ushort *)(buf + 2) << 8 | *(ushort *)(buf + 2) >> 8);
    sVar3 = ((ulong)is_server * 4 - size) + 4;
    this->left_header_len_ = sVar3;
    lStack_8 = 4;
  }
  else {
    this->len_bytes_ = LONG_HEADER;
    uVar2 = *(ulong *)(buf + 2);
    this->payload_length_ =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    sVar3 = ((ulong)is_server * 4 + 10) - size;
    this->left_header_len_ = sVar3;
    lStack_8 = 10;
  }
  if ((char)bVar1 < '\0') {
    *(undefined4 *)this->mask_key_ = *(undefined4 *)(buf + lStack_8);
  }
  return (uint)(sVar3 == 0) * 2 + incomplete;
}

Assistant:

ws_header_status parse_header(const char *buf, size_t size,
                                bool is_server = true) {
    const unsigned char *inp = (const unsigned char *)(buf);

    msg_opcode_ = inp[0] & 0x0F;
    msg_fin_ = (inp[0] >> 7) & 0x01;
    unsigned char msg_masked = (inp[1] >> 7) & 0x01;

    int pos = 2;
    int length_field = inp[1] & (~0x80);

    left_header_len_ = 0;
    if (length_field <= 125) {
      len_bytes_ = SHORT_HEADER;
      payload_length_ = length_field;
    }
    else if (length_field == 126)  // msglen is 16bit!
    {
      len_bytes_ = MEDIUM_HEADER;
      payload_length_ = ntohs(*(uint16_t *)&inp[2]);  // (inp[2] << 8) + inp[3];
      pos += 2;
      left_header_len_ =
          is_server ? MEDIUM_HEADER - size : CLIENT_MEDIUM_HEADER - size;
    }
    else if (length_field == 127)  // msglen is 64bit!
    {
      len_bytes_ = LONG_HEADER;
      payload_length_ = (size_t)be64toh(*(uint64_t *)&inp[2]);
      pos += 8;
      left_header_len_ =
          is_server ? LONG_HEADER - size : CLIENT_LONG_HEADER - size;
    }
    else {
      len_bytes_ = INVALID_HEADER;
      return ws_header_status::error;
    }

    if (msg_masked) {
      std::memcpy(mask_key_, inp + pos, 4);
    }

    return left_header_len_ == 0 ? ws_header_status::complete
                                 : ws_header_status::incomplete;
  }